

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O3

float Map_MappingComputeDelayWithFanouts(Map_Man_t *p)

{
  Map_Node_t *p_00;
  int iVar1;
  Map_NodeVec_t *pMVar2;
  long lVar3;
  float fVar4;
  
  pMVar2 = p->vMapObjs;
  if (0 < pMVar2->nSize) {
    lVar3 = 0;
    do {
      p_00 = pMVar2->pArray[lVar3];
      iVar1 = Map_NodeIsAnd(p_00);
      if ((iVar1 != 0) && (p_00->pRepr == (Map_Node_t *)0x0)) {
        if (0 < p_00->nRefAct[0]) {
          Map_TimeCutComputeArrival(p_00,p_00->pCutBest[0],0,3.4028235e+37);
        }
        if (0 < p_00->nRefAct[1]) {
          Map_TimeCutComputeArrival(p_00,p_00->pCutBest[1],1,3.4028235e+37);
        }
      }
      lVar3 = lVar3 + 1;
      pMVar2 = p->vMapObjs;
    } while (lVar3 < pMVar2->nSize);
  }
  fVar4 = Map_TimeComputeArrivalMax(p);
  printf("Max arrival times with fanouts = %10.2f.\n",(double)fVar4);
  return fVar4;
}

Assistant:

float Map_MappingComputeDelayWithFanouts( Map_Man_t * p )
{
    Map_Node_t * pNode;
    float Result;
    int i;
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        // skip primary inputs
        pNode = p->vMapObjs->pArray[i];
        if ( !Map_NodeIsAnd( pNode ) )
            continue;
        // skip a secondary node
        if ( pNode->pRepr )
            continue;
        // count the switching nodes
        if ( pNode->nRefAct[0] > 0 )
            Map_TimeCutComputeArrival( pNode, pNode->pCutBest[0], 0, MAP_FLOAT_LARGE );
        if ( pNode->nRefAct[1] > 0 )
            Map_TimeCutComputeArrival( pNode, pNode->pCutBest[1], 1, MAP_FLOAT_LARGE );
    }
    Result = Map_TimeComputeArrivalMax(p);
    printf( "Max arrival times with fanouts = %10.2f.\n", Result );
    return Result;
}